

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestString.cpp
# Opt level: O2

void __thiscall UnitTest_string1::Run(UnitTest_string1 *this)

{
  bool bVar1;
  __type _Var2;
  String str2;
  String str1;
  string local_d0;
  string local_b0;
  String local_90;
  String local_58;
  
  luna::String::String(&local_58,"abc");
  luna::String::String(&local_90,"abc");
  bVar1 = luna::operator==(&local_58,&local_90);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_d0,"\'str1 == str2\'",(allocator *)&local_b0);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  bVar1 = luna::operator<=(&local_58,&local_90);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_d0,"\'str1 <= str2\'",(allocator *)&local_b0);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  bVar1 = luna::operator>=(&local_58,&local_90);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_d0,"\'str1 >= str2\'",(allocator *)&local_b0);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  if (local_58.hash_ != local_90.hash_) {
    std::__cxx11::string::string
              ((string *)&local_d0,"\'str1.GetHash() == str2.GetHash()\'",(allocator *)&local_b0);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  if (local_58.length_ != local_90.length_) {
    std::__cxx11::string::string
              ((string *)&local_d0,"\'str1.GetLength() == str2.GetLength()\'",(allocator *)&local_b0
              );
    UnitTestBase::Error(&this->super_UnitTestBase,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  luna::String::GetStdString_abi_cxx11_(&local_d0,&local_58);
  luna::String::GetStdString_abi_cxx11_(&local_b0,&local_90);
  _Var2 = std::operator==(&local_d0,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  if (!_Var2) {
    std::__cxx11::string::string
              ((string *)&local_d0,"\'str1.GetStdString() == str2.GetStdString()\'",
               (allocator *)&local_b0);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  luna::String::SetValue(&local_58,"abcdefghijklmn");
  luna::String::SetValue(&local_90,"abcdefghijklmnopqrst");
  bVar1 = luna::operator!=(&local_58,&local_90);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_d0,"\'str1 != str2\'",(allocator *)&local_b0);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  bVar1 = luna::operator<(&local_58,&local_90);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_d0,"\'str1 < str2\'",(allocator *)&local_b0);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  bVar1 = luna::operator<(&local_58,&local_90);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_d0,"\'str2 > str1\'",(allocator *)&local_b0);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  if (local_90.length_ <= local_58.length_) {
    std::__cxx11::string::string
              ((string *)&local_d0,"\'str1.GetLength() < str2.GetLength()\'",(allocator *)&local_b0)
    ;
    UnitTestBase::Error(&this->super_UnitTestBase,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  luna::String::GetStdString_abi_cxx11_(&local_d0,&local_58);
  luna::String::GetStdString_abi_cxx11_(&local_b0,&local_90);
  bVar1 = std::operator!=(&local_d0,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  if (!bVar1) {
    std::__cxx11::string::string
              ((string *)&local_d0,"\'str1.GetStdString() != str2.GetStdString()\'",
               (allocator *)&local_b0);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  luna::String::SetValue(&local_58,"abc");
  luna::String::SetValue(&local_90,"def");
  bVar1 = luna::operator!=(&local_58,&local_90);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_d0,"\'str1 != str2\'",(allocator *)&local_b0);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  bVar1 = luna::operator<(&local_58,&local_90);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_d0,"\'str1 < str2\'",(allocator *)&local_b0);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  bVar1 = luna::operator<(&local_58,&local_90);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_d0,"\'str2 > str1\'",(allocator *)&local_b0);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  if (local_58.length_ != local_90.length_) {
    std::__cxx11::string::string
              ((string *)&local_d0,"\'str1.GetLength() == str2.GetLength()\'",(allocator *)&local_b0
              );
    UnitTestBase::Error(&this->super_UnitTestBase,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  luna::String::GetStdString_abi_cxx11_(&local_d0,&local_58);
  luna::String::GetStdString_abi_cxx11_(&local_b0,&local_90);
  bVar1 = std::operator!=(&local_d0,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  if (!bVar1) {
    std::__cxx11::string::string
              ((string *)&local_d0,"\'str1.GetStdString() != str2.GetStdString()\'",
               (allocator *)&local_b0);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  luna::String::~String(&local_90);
  luna::String::~String(&local_58);
  return;
}

Assistant:

TEST_CASE(string1)
{
    luna::String str1("abc");
    luna::String str2("abc");

    EXPECT_TRUE(str1 == str2);
    EXPECT_TRUE(str1 <= str2);
    EXPECT_TRUE(str1 >= str2);
    EXPECT_TRUE(str1.GetHash() == str2.GetHash());
    EXPECT_TRUE(str1.GetLength() == str2.GetLength());
    EXPECT_TRUE(str1.GetStdString() == str2.GetStdString());

    str1.SetValue("abcdefghijklmn");
    str2.SetValue("abcdefghijklmnopqrst");
    EXPECT_TRUE(str1 != str2);
    EXPECT_TRUE(str1 < str2);
    EXPECT_TRUE(str2 > str1);
    EXPECT_TRUE(str1.GetLength() < str2.GetLength());
    EXPECT_TRUE(str1.GetStdString() != str2.GetStdString());

    str1.SetValue("abc");
    str2.SetValue("def");
    EXPECT_TRUE(str1 != str2);
    EXPECT_TRUE(str1 < str2);
    EXPECT_TRUE(str2 > str1);
    EXPECT_TRUE(str1.GetLength() == str2.GetLength());
    EXPECT_TRUE(str1.GetStdString() != str2.GetStdString());
}